

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  ulong uVar29;
  long lVar30;
  bool bVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  if (w == 8) {
    uVar29 = 0;
    if (0 < h) {
      uVar29 = (ulong)(uint)h;
    }
    lVar32 = 0;
    lVar33 = 0;
    while (bVar31 = uVar29 != 0, uVar29 = uVar29 - 1, bVar31) {
      uVar3 = *(ulong *)dst;
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7[0xe] = (char)(uVar3 >> 0x38);
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar3;
      auVar9[0xc] = (char)(uVar3 >> 0x30);
      auVar9._13_2_ = auVar7._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar3;
      auVar11._12_3_ = auVar9._12_3_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar3;
      auVar13[10] = (char)(uVar3 >> 0x28);
      auVar13._11_4_ = auVar11._11_4_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar3;
      auVar15._10_5_ = auVar13._10_5_;
      auVar17[8] = (char)(uVar3 >> 0x20);
      auVar17._0_8_ = uVar3;
      auVar17._9_6_ = auVar15._9_6_;
      auVar24._7_8_ = 0;
      auVar24._0_7_ = auVar17._8_7_;
      Var22 = CONCAT81(SUB158(auVar24 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar27._9_6_ = 0;
      auVar27._0_9_ = Var22;
      auVar25._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar25[0] = (char)(uVar3 >> 0x10);
      auVar28._11_4_ = 0;
      auVar28._0_11_ = auVar25;
      auVar20[2] = (char)(uVar3 >> 8);
      auVar20._0_2_ = (ushort)uVar3;
      auVar20._3_12_ = SUB1512(auVar28 << 0x20,3);
      auVar35._0_2_ = *src - ((ushort)uVar3 & 0xff);
      auVar35._2_2_ = src[1] - auVar20._2_2_;
      auVar35._4_2_ = src[2] - auVar25._0_2_;
      auVar35._6_2_ = src[3] - (short)Var22;
      auVar35._8_2_ = src[4] - auVar17._8_2_;
      auVar35._10_2_ = src[5] - auVar13._10_2_;
      auVar35._12_2_ = src[6] - auVar9._12_2_;
      auVar35._14_2_ = src[7] - (auVar7._13_2_ >> 8);
      auVar35 = pmaddwd(auVar35,auVar35);
      lVar32 = lVar32 + (ulong)auVar35._8_4_ + (auVar35._0_8_ & 0xffffffff);
      lVar33 = lVar33 + (ulong)auVar35._12_4_ + (ulong)auVar35._4_4_;
      src = src + sstride;
      dst = (uint8_t *)((long)dst + (long)dstride);
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    lVar32 = 0;
    lVar33 = 0;
    for (lVar30 = 0; lVar30 < h; lVar30 = lVar30 + 2) {
      uVar4 = *(undefined4 *)(dst + dstride);
      uVar5 = *(undefined4 *)dst;
      uVar29 = CONCAT44(uVar4,uVar5);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar29;
      auVar6[0xe] = (char)((uint)uVar4 >> 0x18);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar29;
      auVar8[0xc] = (char)((uint)uVar4 >> 0x10);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar29;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar29;
      auVar12[10] = (char)((uint)uVar4 >> 8);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar29;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = (char)uVar4;
      auVar16._0_8_ = uVar29;
      auVar16._9_6_ = auVar14._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar16._8_7_;
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),(char)((uint)uVar5 >> 0x18));
      auVar26._9_6_ = 0;
      auVar26._0_9_ = Var22;
      auVar18[4] = (char)((uint)uVar5 >> 0x10);
      auVar18._0_4_ = uVar5;
      auVar18._5_10_ = SUB1510(auVar26 << 0x30,5);
      auVar23._11_4_ = 0;
      auVar23._0_11_ = auVar18._4_11_;
      auVar19[2] = (char)((uint)uVar5 >> 8);
      auVar19._0_2_ = (ushort)uVar5;
      auVar19._3_12_ = SUB1512(auVar23 << 0x20,3);
      uVar1 = *(undefined8 *)(src + sstride);
      uVar2 = *(undefined8 *)src;
      auVar34._0_2_ = (short)uVar2 - ((ushort)uVar5 & 0xff);
      auVar34._2_2_ = (short)((ulong)uVar2 >> 0x10) - auVar19._2_2_;
      auVar34._4_2_ = (short)((ulong)uVar2 >> 0x20) - auVar18._4_2_;
      auVar34._6_2_ = (short)((ulong)uVar2 >> 0x30) - (short)Var22;
      auVar34._8_2_ = (short)uVar1 - auVar16._8_2_;
      auVar34._10_2_ = (short)((ulong)uVar1 >> 0x10) - auVar12._10_2_;
      auVar34._12_2_ = (short)((ulong)uVar1 >> 0x20) - auVar8._12_2_;
      auVar34._14_2_ = (short)((ulong)uVar1 >> 0x30) - (auVar6._13_2_ >> 8);
      auVar35 = pmaddwd(auVar34,auVar34);
      lVar32 = lVar32 + (ulong)auVar35._8_4_ + (auVar35._0_8_ & 0xffffffff);
      lVar33 = lVar33 + (ulong)auVar35._12_4_ + (ulong)auVar35._4_4_;
      src = src + (long)sstride * 2;
      dst = dst + (long)dstride * 2;
    }
  }
  return lVar33 + lVar32;
}

Assistant:

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                int sstride, int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_sse2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_sse2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}